

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  CURL_conflict *pCVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  byte bVar6;
  size_type sVar7;
  reference pbVar8;
  char *pcVar9;
  string *psVar10;
  pointer pbVar11;
  undefined8 uVar12;
  ulong uVar13;
  ostream *poVar14;
  pointer pcVar15;
  value_type local_11c1;
  string local_11c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1180;
  undefined1 local_1160 [8];
  string status;
  ostringstream oss;
  allocator<char> local_fc1;
  string local_fc0;
  undefined1 local_fa0 [8];
  string actualHash_1;
  ostringstream local_f60 [8];
  ostringstream result_1;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  undefined1 local_db8 [8];
  string e_15;
  undefined1 local_d90 [8];
  string e_14;
  undefined1 local_d68 [8];
  string e_13;
  undefined1 local_d40 [8];
  string e_12;
  cURLProgressHelper helper;
  undefined1 local_ce8 [8];
  string e_11;
  undefined1 local_cc0 [8];
  string e_10;
  undefined1 local_c98 [8];
  string e_9;
  undefined1 local_c70 [8];
  string e_8;
  undefined1 local_c48 [8];
  string e_7;
  cmFileCommandVectorOfChar chunkDebug;
  string *netrc_option_err;
  string local_bc8;
  string *local_ba8;
  string *cainfo_err;
  undefined1 local_b98 [8];
  string e_6;
  undefined1 local_b70 [8];
  string e_5;
  undefined1 local_b48 [8];
  string e_4;
  undefined1 local_b20 [8];
  string e_3;
  undefined1 local_af8 [8];
  string e_2;
  undefined1 local_ad0 [8];
  string e_1;
  undefined1 local_aa8 [8];
  string e;
  CURLcode res;
  cURLEasyGuard g_curl;
  string local_a70;
  CURL_conflict *local_a50;
  CURL *curl;
  string local_a40;
  long local_a20;
  ofstream fout;
  undefined1 local_800 [8];
  string errstring;
  string dir;
  ostringstream local_7a0 [8];
  ostringstream result;
  undefined1 local_628 [8];
  string actualHash;
  string msg;
  undefined1 local_5e0 [8];
  string err_2;
  string local_5b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_598;
  allocator<char> local_589;
  string local_588;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  allocator<char> local_539;
  undefined1 local_538 [8];
  string err_1;
  string local_4f0;
  undefined1 local_4d0 [8];
  string algo;
  undefined1 local_4a8 [8];
  string err;
  size_type pos;
  string local_478;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_458;
  string local_450;
  undefined4 local_42c;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> local_428;
  allocator<char> local_419;
  string local_418;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f8;
  allocator<char> local_3e9;
  string local_3e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c8;
  allocator<char> local_3b9;
  string local_3b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_398;
  allocator<char> local_389;
  string local_388;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_368;
  allocator<char> local_359;
  string local_358;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_338;
  allocator<char> local_329;
  string local_328;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  allocator<char> local_2f9;
  string local_2f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  allocator<char> local_2c9;
  string local_2c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  int local_2a0;
  allocator<char> local_299;
  string local_298;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  undefined1 local_268 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string userpwd;
  bool showProgress;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  string hashMatchMSG;
  string expectedHash;
  string local_1d8;
  undefined1 local_1b8 [8];
  string netrc_file;
  string local_190;
  undefined1 local_170 [8];
  string netrc_level;
  string local_148;
  char *local_128;
  char *cainfo;
  string local_118;
  byte local_f1;
  undefined1 local_f0 [7];
  bool tls_verify;
  string statusVar;
  string logVar;
  long inactivity_timeout;
  long timeout;
  string file;
  string url;
  allocator<char> local_49;
  string local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)i._M_current);
  if (sVar7 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"DOWNLOAD must be called with at least three arguments.",
               &local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_002c014d;
  }
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  pbVar8 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_28);
  std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8),(string *)pbVar8);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  pbVar8 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_28);
  std::__cxx11::string::string((string *)&timeout,(string *)pbVar8);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  inactivity_timeout = 0;
  logVar.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CMAKE_TLS_VERIFY",(allocator<char> *)((long)&cainfo + 7));
  bVar3 = cmMakefile::IsOn(pcVar1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo + 7));
  pcVar1 = (this->super_cmCommand).Makefile;
  local_f1 = bVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"CMAKE_TLS_CAINFO",
             (allocator<char> *)(netrc_level.field_2._M_local_buf + 0xf));
  pcVar9 = cmMakefile::GetDefinition(pcVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(netrc_level.field_2._M_local_buf + 0xf));
  pcVar1 = (this->super_cmCommand).Makefile;
  local_128 = pcVar9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"CMAKE_NETRC",
             (allocator<char> *)(netrc_file.field_2._M_local_buf + 0xf));
  psVar10 = cmMakefile::GetSafeDefinition(pcVar1,&local_190);
  std::__cxx11::string::string((string *)local_170,(string *)psVar10);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)(netrc_file.field_2._M_local_buf + 0xf));
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"CMAKE_NETRC_FILE",
             (allocator<char> *)(expectedHash.field_2._M_local_buf + 0xf));
  psVar10 = cmMakefile::GetSafeDefinition(pcVar1,&local_1d8);
  std::__cxx11::string::string((string *)local_1b8,(string *)psVar10);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(expectedHash.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(hashMatchMSG.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&hash);
  std::unique_ptr<cmCryptoHash,std::default_delete<cmCryptoHash>>::
  unique_ptr<std::default_delete<cmCryptoHash>,void>
            ((unique_ptr<cmCryptoHash,std::default_delete<cmCryptoHash>> *)&stack0xfffffffffffffdd8)
  ;
  bVar3 = false;
  std::__cxx11::string::string
            ((string *)
             &curl_headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_268);
  while( true ) {
    local_270._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(i._M_current);
    bVar4 = __gnu_cxx::operator!=(&local_28,&local_270);
    if (!bVar4) break;
    pbVar8 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_28);
    bVar4 = std::operator==(pbVar8,"TIMEOUT");
    if (bVar4) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_28);
      local_278._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(i._M_current);
      bVar4 = __gnu_cxx::operator!=(&local_28,&local_278);
      if (!bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"DOWNLOAD missing time for TIMEOUT.",&local_299);
        cmCommand::SetError(&this->super_cmCommand,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator(&local_299);
        this_local._7_1_ = 0;
        local_2a0 = 1;
        goto LAB_002c0044;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_28);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      inactivity_timeout = atol(pcVar9);
    }
    else {
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
      bVar4 = std::operator==(pbVar8,"INACTIVITY_TIMEOUT");
      if (bVar4) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_28);
        local_2a8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(i._M_current);
        bVar4 = __gnu_cxx::operator!=(&local_28,&local_2a8);
        if (!bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.",&local_2c9
                    );
          cmCommand::SetError(&this->super_cmCommand,&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::allocator<char>::~allocator(&local_2c9);
          this_local._7_1_ = 0;
          local_2a0 = 1;
          goto LAB_002c0044;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_28);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        logVar.field_2._8_8_ = atol(pcVar9);
      }
      else {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_28);
        bVar4 = std::operator==(pbVar8,"LOG");
        if (bVar4) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_28);
          local_2d8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(i._M_current);
          bVar4 = __gnu_cxx::operator==(&local_28,&local_2d8);
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f8,"DOWNLOAD missing VAR for LOG.",&local_2f9);
            cmCommand::SetError(&this->super_cmCommand,&local_2f8);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::allocator<char>::~allocator(&local_2f9);
            this_local._7_1_ = 0;
            local_2a0 = 1;
            goto LAB_002c0044;
          }
          pbVar8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_28);
          std::__cxx11::string::operator=
                    ((string *)(statusVar.field_2._M_local_buf + 8),(string *)pbVar8);
        }
        else {
          pbVar8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_28);
          bVar4 = std::operator==(pbVar8,"STATUS");
          if (bVar4) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_28);
            local_308._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(i._M_current);
            bVar4 = __gnu_cxx::operator==(&local_28,&local_308);
            if (bVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_328,"DOWNLOAD missing VAR for STATUS.",&local_329);
              cmCommand::SetError(&this->super_cmCommand,&local_328);
              std::__cxx11::string::~string((string *)&local_328);
              std::allocator<char>::~allocator(&local_329);
              this_local._7_1_ = 0;
              local_2a0 = 1;
              goto LAB_002c0044;
            }
            pbVar8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_28);
            std::__cxx11::string::operator=((string *)local_f0,(string *)pbVar8);
          }
          else {
            pbVar8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_28);
            bVar4 = std::operator==(pbVar8,"TLS_VERIFY");
            if (bVar4) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_28);
              local_338._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(i._M_current);
              bVar4 = __gnu_cxx::operator!=(&local_28,&local_338);
              if (!bVar4) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_358,"TLS_VERIFY missing bool value.",&local_359);
                cmCommand::SetError(&this->super_cmCommand,&local_358);
                std::__cxx11::string::~string((string *)&local_358);
                std::allocator<char>::~allocator(&local_359);
                this_local._7_1_ = 0;
                local_2a0 = 1;
                goto LAB_002c0044;
              }
              pbVar8 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_28);
              local_f1 = cmSystemTools::IsOn(pbVar8);
            }
            else {
              pbVar8 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_28);
              bVar4 = std::operator==(pbVar8,"TLS_CAINFO");
              if (bVar4) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_28);
                local_368._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(i._M_current);
                bVar4 = __gnu_cxx::operator!=(&local_28,&local_368);
                if (!bVar4) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_388,"TLS_CAFILE missing file value.",&local_389);
                  cmCommand::SetError(&this->super_cmCommand,&local_388);
                  std::__cxx11::string::~string((string *)&local_388);
                  std::allocator<char>::~allocator(&local_389);
                  this_local._7_1_ = 0;
                  local_2a0 = 1;
                  goto LAB_002c0044;
                }
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator->(&local_28);
                local_128 = (char *)std::__cxx11::string::c_str();
              }
              else {
                pbVar8 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_28);
                bVar4 = std::operator==(pbVar8,"NETRC_FILE");
                if (bVar4) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_28);
                  local_398._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(i._M_current);
                  bVar4 = __gnu_cxx::operator!=(&local_28,&local_398);
                  if (!bVar4) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3b8,"DOWNLOAD missing file value for NETRC_FILE.",
                               &local_3b9);
                    cmCommand::SetError(&this->super_cmCommand,&local_3b8);
                    std::__cxx11::string::~string((string *)&local_3b8);
                    std::allocator<char>::~allocator(&local_3b9);
                    this_local._7_1_ = 0;
                    local_2a0 = 1;
                    goto LAB_002c0044;
                  }
                  pbVar8 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_28);
                  std::__cxx11::string::operator=((string *)local_1b8,(string *)pbVar8);
                }
                else {
                  pbVar8 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_28);
                  bVar4 = std::operator==(pbVar8,"NETRC");
                  if (bVar4) {
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&local_28);
                    local_3c8._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end(i._M_current);
                    bVar4 = __gnu_cxx::operator!=(&local_28,&local_3c8);
                    if (!bVar4) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3e8,"DOWNLOAD missing level value for NETRC.",
                                 &local_3e9);
                      cmCommand::SetError(&this->super_cmCommand,&local_3e8);
                      std::__cxx11::string::~string((string *)&local_3e8);
                      std::allocator<char>::~allocator(&local_3e9);
                      this_local._7_1_ = 0;
                      local_2a0 = 1;
                      goto LAB_002c0044;
                    }
                    pbVar8 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_28);
                    std::__cxx11::string::operator=((string *)local_170,(string *)pbVar8);
                  }
                  else {
                    pbVar8 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_28);
                    bVar4 = std::operator==(pbVar8,"EXPECTED_MD5");
                    if (bVar4) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&local_28);
                      local_3f8._M_current =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end(i._M_current);
                      bVar4 = __gnu_cxx::operator==(&local_28,&local_3f8);
                      if (bVar4) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_418,
                                   "DOWNLOAD missing sum value for EXPECTED_MD5.",&local_419);
                        cmCommand::SetError(&this->super_cmCommand,&local_418);
                        std::__cxx11::string::~string((string *)&local_418);
                        std::allocator<char>::~allocator(&local_419);
                        this_local._7_1_ = 0;
                        local_2a0 = 1;
                        goto LAB_002c0044;
                      }
                      local_42c = 0;
                      std::make_unique<cmCryptoHash,cmCryptoHash::Algo>((Algo *)&local_428);
                      std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::operator=
                                ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                                 &stack0xfffffffffffffdd8,&local_428);
                      std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                                (&local_428);
                      std::__cxx11::string::operator=((string *)&hash,"MD5 sum");
                      pbVar8 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*(&local_28);
                      cmsys::SystemTools::LowerCase(&local_450,pbVar8);
                      std::__cxx11::string::operator=
                                ((string *)(hashMatchMSG.field_2._M_local_buf + 8),
                                 (string *)&local_450);
                      std::__cxx11::string::~string((string *)&local_450);
                    }
                    else {
                      pbVar8 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*(&local_28);
                      bVar4 = std::operator==(pbVar8,"SHOW_PROGRESS");
                      if (bVar4) {
                        bVar3 = true;
                      }
                      else {
                        pbVar8 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_28);
                        bVar4 = std::operator==(pbVar8,"EXPECTED_HASH");
                        if (bVar4) {
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator++(&local_28);
                          local_458._M_current =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::end(i._M_current);
                          bVar4 = __gnu_cxx::operator==(&local_28,&local_458);
                          if (bVar4) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_478,
                                       "DOWNLOAD missing ALGO=value for EXPECTED_HASH.",
                                       (allocator<char> *)((long)&pos + 7));
                            cmCommand::SetError(&this->super_cmCommand,&local_478);
                            std::__cxx11::string::~string((string *)&local_478);
                            std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
                            this_local._7_1_ = 0;
                            local_2a0 = 1;
                            goto LAB_002c0044;
                          }
                          pbVar11 = __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator->(&local_28);
                          err.field_2._8_8_ = std::__cxx11::string::find((char *)pbVar11,0x7c2480);
                          if (err.field_2._8_8_ == -1) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_4a8,
                                       "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ",
                                       (allocator<char> *)(algo.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(algo.field_2._M_local_buf + 0xf));
                            pbVar8 = __gnu_cxx::
                                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator*(&local_28);
                            std::__cxx11::string::operator+=((string *)local_4a8,(string *)pbVar8);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_4a8);
                            this_local._7_1_ = 0;
                            local_2a0 = 1;
                            std::__cxx11::string::~string((string *)local_4a8);
                            goto LAB_002c0044;
                          }
                          pbVar11 = __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator->(&local_28);
                          std::__cxx11::string::substr((ulong)local_4d0,(ulong)pbVar11);
                          pbVar11 = __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator->(&local_28);
                          std::__cxx11::string::substr
                                    ((ulong)&stack0xfffffffffffffaf0,(ulong)pbVar11);
                          cmsys::SystemTools::LowerCase
                                    (&local_4f0,(string *)&stack0xfffffffffffffaf0);
                          std::__cxx11::string::operator=
                                    ((string *)(hashMatchMSG.field_2._M_local_buf + 8),
                                     (string *)&local_4f0);
                          std::__cxx11::string::~string((string *)&local_4f0);
                          std::__cxx11::string::~string((string *)&stack0xfffffffffffffaf0);
                          pcVar9 = (char *)std::__cxx11::string::c_str();
                          cmCryptoHash::New((cmCryptoHash *)((long)&err_1.field_2 + 8),pcVar9);
                          std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                          operator=((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                                    &stack0xfffffffffffffdd8,
                                    (unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                                    ((long)&err_1.field_2 + 8));
                          std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                          ~unique_ptr((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                       *)((long)&err_1.field_2 + 8));
                          bVar4 = std::unique_ptr::operator_cast_to_bool
                                            ((unique_ptr *)&stack0xfffffffffffffdd8);
                          if (bVar4) {
                            std::operator+(&local_560,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_4d0," hash");
                            std::__cxx11::string::operator=((string *)&hash,(string *)&local_560);
                            std::__cxx11::string::~string((string *)&local_560);
                            local_2a0 = 0;
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_538,
                                       "DOWNLOAD EXPECTED_HASH given unknown ALGO: ",&local_539);
                            std::allocator<char>::~allocator(&local_539);
                            std::__cxx11::string::operator+=
                                      ((string *)local_538,(string *)local_4d0);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_538);
                            this_local._7_1_ = 0;
                            local_2a0 = 1;
                            std::__cxx11::string::~string((string *)local_538);
                          }
                          std::__cxx11::string::~string((string *)local_4d0);
                          if (local_2a0 != 0) goto LAB_002c0044;
                        }
                        else {
                          pbVar8 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*(&local_28);
                          bVar4 = std::operator==(pbVar8,"USERPWD");
                          if (bVar4) {
                            __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator++(&local_28);
                            local_568._M_current =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::end(i._M_current);
                            bVar4 = __gnu_cxx::operator==(&local_28,&local_568);
                            if (bVar4) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_588,"DOWNLOAD missing string for USERPWD."
                                         ,&local_589);
                              cmCommand::SetError(&this->super_cmCommand,&local_588);
                              std::__cxx11::string::~string((string *)&local_588);
                              std::allocator<char>::~allocator(&local_589);
                              this_local._7_1_ = 0;
                              local_2a0 = 1;
                              goto LAB_002c0044;
                            }
                            pbVar8 = __gnu_cxx::
                                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator*(&local_28);
                            std::__cxx11::string::operator=
                                      ((string *)
                                       &curl_headers.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (string *)pbVar8);
                          }
                          else {
                            pbVar8 = __gnu_cxx::
                                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator*(&local_28);
                            bVar4 = std::operator==(pbVar8,"HTTPHEADER");
                            if (bVar4) {
                              __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator++(&local_28);
                              local_598._M_current =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::end(i._M_current);
                              bVar4 = __gnu_cxx::operator==(&local_28,&local_598);
                              if (bVar4) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_5b8,
                                           "DOWNLOAD missing string for HTTPHEADER.",
                                           (allocator<char> *)(err_2.field_2._M_local_buf + 0xf));
                                cmCommand::SetError(&this->super_cmCommand,&local_5b8);
                                std::__cxx11::string::~string((string *)&local_5b8);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(err_2.field_2._M_local_buf + 0xf));
                                this_local._7_1_ = 0;
                                local_2a0 = 1;
                                goto LAB_002c0044;
                              }
                              pbVar8 = __gnu_cxx::
                                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ::operator*(&local_28);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_268,pbVar8);
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_5e0,"Unexpected argument: ",
                                         (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
                              pbVar8 = __gnu_cxx::
                                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ::operator*(&local_28);
                              std::__cxx11::string::operator+=((string *)local_5e0,(string *)pbVar8)
                              ;
                              cmMakefile::IssueMessage
                                        ((this->super_cmCommand).Makefile,AUTHOR_WARNING,
                                         (string *)local_5e0);
                              std::__cxx11::string::~string((string *)local_5e0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  bVar4 = cmsys::SystemTools::FileExists((string *)&timeout);
  if ((bVar4) &&
     (pcVar15 = std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::get
                          ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                           &stack0xfffffffffffffdd8), pcVar15 != (pointer)0x0)) {
    std::__cxx11::string::string((string *)(actualHash.field_2._M_local_buf + 8));
    pcVar15 = std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::operator->
                        ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                         &stack0xfffffffffffffdd8);
    cmCryptoHash::HashFile((string *)local_628,pcVar15,(string *)&timeout);
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_628,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&hashMatchMSG.field_2 + 8));
    if (_Var5) {
      std::__cxx11::string::operator=
                ((string *)(actualHash.field_2._M_local_buf + 8),
                 "returning early; file already exists with expected ");
      std::__cxx11::string::operator+=
                ((string *)(actualHash.field_2._M_local_buf + 8),(string *)&hash);
      std::__cxx11::string::operator+=((string *)(actualHash.field_2._M_local_buf + 8),"\"");
      uVar13 = std::__cxx11::string::empty();
      if ((uVar13 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_7a0);
        poVar14 = (ostream *)std::ostream::operator<<(local_7a0,0);
        poVar14 = std::operator<<(poVar14,";\"");
        std::operator<<(poVar14,(string *)(actualHash.field_2._M_local_buf + 8));
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_f0,pcVar9);
        std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream(local_7a0);
      }
      this_local._7_1_ = 1;
      local_2a0 = 1;
    }
    else {
      local_2a0 = 0;
    }
    std::__cxx11::string::~string((string *)local_628);
    std::__cxx11::string::~string((string *)(actualHash.field_2._M_local_buf + 8));
    if (local_2a0 == 0) goto LAB_002be0d1;
  }
  else {
LAB_002be0d1:
    cmsys::SystemTools::GetFilenamePath((string *)((long)&errstring.field_2 + 8),(string *)&timeout)
    ;
    bVar4 = cmsys::SystemTools::FileExists((string *)((long)&errstring.field_2 + 8));
    if ((bVar4) ||
       (bVar4 = cmsys::SystemTools::MakeDirectory
                          ((string *)((long)&errstring.field_2 + 8),(mode_t *)0x0), bVar4)) {
      pcVar9 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(&local_a20,pcVar9,_S_bin);
      bVar6 = std::ios::operator!((ios *)((long)&local_a20 + *(long *)(local_a20 + -0x18)));
      if ((bVar6 & 1) == 0) {
        curl_global_init(3);
        local_a50 = curl_easy_init();
        if (local_a50 == (CURL_conflict *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a70,"DOWNLOAD error initializing curl.",
                     (allocator<char> *)((long)&g_curl.Easy + 7));
          cmCommand::SetError(&this->super_cmCommand,&local_a70);
          std::__cxx11::string::~string((string *)&local_a70);
          std::allocator<char>::~allocator((allocator<char> *)((long)&g_curl.Easy + 7));
          this_local._7_1_ = 0;
          local_2a0 = 1;
        }
        else {
          anon_unknown.dwarf_353d22::cURLEasyGuard::cURLEasyGuard
                    ((cURLEasyGuard *)&stack0xfffffffffffff580,local_a50);
          pCVar2 = local_a50;
          uVar12 = std::__cxx11::string::c_str();
          e.field_2._12_4_ = curl_easy_setopt(pCVar2,CURLOPT_URL,uVar12);
          if (e.field_2._12_4_ == CURLE_OK) {
            e.field_2._12_4_ = curl_easy_setopt(local_a50,CURLOPT_FAILONERROR,1);
            if (e.field_2._12_4_ == CURLE_OK) {
              e.field_2._12_4_ = curl_easy_setopt(local_a50,CURLOPT_USERAGENT,"curl/7.62.0");
              if (e.field_2._12_4_ == CURLE_OK) {
                e.field_2._12_4_ =
                     curl_easy_setopt(local_a50,CURLOPT_WRITEFUNCTION,
                                      anon_unknown.dwarf_353d22::cmWriteToFileCallback);
                if (e.field_2._12_4_ == CURLE_OK) {
                  e.field_2._12_4_ =
                       curl_easy_setopt(local_a50,CURLOPT_DEBUGFUNCTION,
                                        anon_unknown.dwarf_353d22::cmFileCommandCurlDebugCallback);
                  if (e.field_2._12_4_ == CURLE_OK) {
                    if ((local_f1 & 1) == 0) {
                      e.field_2._12_4_ = curl_easy_setopt(local_a50,CURLOPT_SSL_VERIFYPEER,0);
                      if (e.field_2._12_4_ == CURLE_OK) goto LAB_002beb94;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_b98,"Unable to set TLS/SSL Verify off: ",
                                 (allocator<char> *)((long)&cainfo_err + 7));
                      std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo_err + 7));
                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                      std::__cxx11::string::operator+=((string *)local_b98,pcVar9);
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_b98);
                      this_local._7_1_ = 0;
                      local_2a0 = 1;
                      std::__cxx11::string::~string((string *)local_b98);
                    }
                    else {
                      e.field_2._12_4_ = curl_easy_setopt(local_a50,CURLOPT_SSL_VERIFYPEER,1);
                      if (e.field_2._12_4_ == CURLE_OK) {
LAB_002beb94:
                        cmCurlSetCAInfo_abi_cxx11_(&local_bc8,local_a50,local_128);
                        local_ba8 = &local_bc8;
                        uVar13 = std::__cxx11::string::empty();
                        if ((uVar13 & 1) == 0) {
                          cmCommand::SetError(&this->super_cmCommand,local_ba8);
                          this_local._7_1_ = 0;
                          local_2a0 = 1;
                        }
                        else {
                          cmsys::SystemTools::UpperCase
                                    ((string *)&netrc_option_err,(string *)local_170);
                          std::__cxx11::string::operator=
                                    ((string *)local_170,(string *)&netrc_option_err);
                          std::__cxx11::string::~string((string *)&netrc_option_err);
                          cmCurlSetNETRCOption
                                    ((string *)
                                     &chunkDebug.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x10,local_a50,(string *)local_170,
                                     (string *)local_1b8);
                          uVar13 = std::__cxx11::string::empty();
                          if ((uVar13 & 1) == 0) {
                            cmCommand::SetError(&this->super_cmCommand,
                                                (string *)
                                                &chunkDebug.
                                                 super__Vector_base<char,_std::allocator<char>_>.
                                                 _M_impl.field_0x10);
                            this_local._7_1_ = 0;
                            local_2a0 = 1;
                          }
                          else {
                            std::vector<char,_std::allocator<char>_>::vector
                                      ((vector<char,_std::allocator<char>_> *)
                                       ((long)&e_7.field_2 + 8));
                            e.field_2._12_4_ =
                                 curl_easy_setopt(local_a50,CURLOPT_WRITEDATA,&local_a20);
                            if (e.field_2._12_4_ == CURLE_OK) {
                              e.field_2._12_4_ =
                                   curl_easy_setopt(local_a50,CURLOPT_DEBUGDATA,
                                                    (undefined1 *)((long)&e_7.field_2 + 8));
                              if (e.field_2._12_4_ == CURLE_OK) {
                                e.field_2._12_4_ =
                                     curl_easy_setopt(local_a50,CURLOPT_FOLLOWLOCATION,1);
                                if (e.field_2._12_4_ == CURLE_OK) {
                                  uVar13 = std::__cxx11::string::empty();
                                  if ((uVar13 & 1) == 0) {
                                    e.field_2._12_4_ = curl_easy_setopt(local_a50,CURLOPT_VERBOSE,1)
                                    ;
                                    if (e.field_2._12_4_ != CURLE_OK) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)local_cc0,"DOWNLOAD cannot set verbose: "
                                                 ,(allocator<char> *)
                                                  (e_11.field_2._M_local_buf + 0xf));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (e_11.field_2._M_local_buf + 0xf));
                                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_cc0,pcVar9);
                                      cmCommand::SetError(&this->super_cmCommand,(string *)local_cc0
                                                         );
                                      this_local._7_1_ = 0;
                                      local_2a0 = 1;
                                      std::__cxx11::string::~string((string *)local_cc0);
                                      goto LAB_002bff99;
                                    }
                                    e.field_2._12_4_ = 0;
                                  }
                                  if (0 < inactivity_timeout) {
                                    e.field_2._12_4_ =
                                         curl_easy_setopt(local_a50,CURLOPT_TIMEOUT,
                                                          inactivity_timeout);
                                    if (e.field_2._12_4_ != CURLE_OK) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)local_ce8,"DOWNLOAD cannot set timeout: "
                                                 ,(allocator<char> *)
                                                  (helper.Text.field_2._M_local_buf + 0xf));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (helper.Text.field_2._M_local_buf + 0xf));
                                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_ce8,pcVar9);
                                      cmCommand::SetError(&this->super_cmCommand,(string *)local_ce8
                                                         );
                                      this_local._7_1_ = 0;
                                      local_2a0 = 1;
                                      std::__cxx11::string::~string((string *)local_ce8);
                                      goto LAB_002bff99;
                                    }
                                    e.field_2._12_4_ = 0;
                                  }
                                  if (0 < (long)logVar.field_2._8_8_) {
                                    curl_easy_setopt(local_a50,CURLOPT_LOW_SPEED_LIMIT,1);
                                    curl_easy_setopt(local_a50,CURLOPT_LOW_SPEED_TIME,
                                                     logVar.field_2._8_8_);
                                  }
                                  anon_unknown.dwarf_353d22::cURLProgressHelper::cURLProgressHelper
                                            ((cURLProgressHelper *)((long)&e_12.field_2 + 8),this,
                                             "download");
                                  if (bVar3) {
                                    e.field_2._12_4_ =
                                         curl_easy_setopt(local_a50,CURLOPT_NOPROGRESS,0);
                                    if (e.field_2._12_4_ == CURLE_OK) {
                                      e.field_2._12_4_ =
                                           curl_easy_setopt(local_a50,CURLOPT_PROGRESSFUNCTION,
                                                            anon_unknown.dwarf_353d22::
                                                            cmFileDownloadProgressCallback);
                                      if (e.field_2._12_4_ == CURLE_OK) {
                                        e.field_2._12_4_ =
                                             curl_easy_setopt(local_a50,CURLOPT_PROGRESSDATA,
                                                              (undefined1 *)
                                                              ((long)&e_12.field_2 + 8));
                                        if (e.field_2._12_4_ == CURLE_OK) {
                                          e.field_2._12_4_ = 0;
                                          goto LAB_002bf603;
                                        }
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)local_d90,
                                                   "DOWNLOAD cannot set progress data: ",
                                                   (allocator<char> *)
                                                   (e_15.field_2._M_local_buf + 0xf));
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)
                                                   (e_15.field_2._M_local_buf + 0xf));
                                        pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                        std::__cxx11::string::operator+=((string *)local_d90,pcVar9)
                                        ;
                                        cmCommand::SetError(&this->super_cmCommand,
                                                            (string *)local_d90);
                                        this_local._7_1_ = 0;
                                        local_2a0 = 1;
                                        std::__cxx11::string::~string((string *)local_d90);
                                      }
                                      else {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)local_d68,
                                                   "DOWNLOAD cannot set progress function: ",
                                                   (allocator<char> *)
                                                   (e_14.field_2._M_local_buf + 0xf));
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)
                                                   (e_14.field_2._M_local_buf + 0xf));
                                        pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                        std::__cxx11::string::operator+=((string *)local_d68,pcVar9)
                                        ;
                                        cmCommand::SetError(&this->super_cmCommand,
                                                            (string *)local_d68);
                                        this_local._7_1_ = 0;
                                        local_2a0 = 1;
                                        std::__cxx11::string::~string((string *)local_d68);
                                      }
                                    }
                                    else {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)local_d40,
                                                 "DOWNLOAD cannot set noprogress value: ",
                                                 (allocator<char> *)
                                                 (e_13.field_2._M_local_buf + 0xf));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (e_13.field_2._M_local_buf + 0xf));
                                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_d40,pcVar9);
                                      cmCommand::SetError(&this->super_cmCommand,(string *)local_d40
                                                         );
                                      this_local._7_1_ = 0;
                                      local_2a0 = 1;
                                      std::__cxx11::string::~string((string *)local_d40);
                                    }
                                  }
                                  else {
LAB_002bf603:
                                    uVar13 = std::__cxx11::string::empty();
                                    pCVar2 = local_a50;
                                    if ((uVar13 & 1) == 0) {
                                      uVar12 = std::__cxx11::string::c_str();
                                      e.field_2._12_4_ =
                                           curl_easy_setopt(pCVar2,CURLOPT_USERPWD,uVar12);
                                      if (e.field_2._12_4_ != CURLE_OK) {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)local_db8,
                                                   "DOWNLOAD cannot set user password: ",
                                                   (allocator<char> *)((long)&headers + 7));
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)((long)&headers + 7));
                                        pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                        std::__cxx11::string::operator+=((string *)local_db8,pcVar9)
                                        ;
                                        cmCommand::SetError(&this->super_cmCommand,
                                                            (string *)local_db8);
                                        this_local._7_1_ = 0;
                                        local_2a0 = 1;
                                        std::__cxx11::string::~string((string *)local_db8);
                                        goto LAB_002bff7d;
                                      }
                                      e.field_2._12_4_ = 0;
                                    }
                                    __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)0x0;
                                    __end1 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_268);
                                    h = (string *)
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_268);
                                    while (bVar3 = __gnu_cxx::operator!=
                                                             (&__end1,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&h), bVar3) {
                                      __gnu_cxx::
                                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::operator*(&__end1);
                                      pcVar9 = (char *)std::__cxx11::string::c_str();
                                      __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)curl_slist_append((curl_slist *)__range1,pcVar9)
                                      ;
                                      __gnu_cxx::
                                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::operator++(&__end1);
                                    }
                                    curl_easy_setopt(local_a50,CURLOPT_HTTPHEADER,__range1);
                                    e.field_2._12_4_ = curl_easy_perform(local_a50);
                                    curl_slist_free_all((curl_slist *)__range1);
                                    anon_unknown.dwarf_353d22::cURLEasyGuard::release
                                              ((cURLEasyGuard *)&stack0xfffffffffffff580);
                                    curl_easy_cleanup(local_a50);
                                    uVar13 = std::__cxx11::string::empty();
                                    if ((uVar13 & 1) == 0) {
                                      std::__cxx11::ostringstream::ostringstream(local_f60);
                                      poVar14 = (ostream *)
                                                std::ostream::operator<<(local_f60,e.field_2._12_4_)
                                      ;
                                      poVar14 = std::operator<<(poVar14,";\"");
                                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                      poVar14 = std::operator<<(poVar14,pcVar9);
                                      std::operator<<(poVar14,"\"");
                                      pcVar1 = (this->super_cmCommand).Makefile;
                                      std::__cxx11::ostringstream::str();
                                      pcVar9 = (char *)std::__cxx11::string::c_str();
                                      cmMakefile::AddDefinition(pcVar1,(string *)local_f0,pcVar9);
                                      std::__cxx11::string::~string
                                                ((string *)(actualHash_1.field_2._M_local_buf + 8));
                                      std::__cxx11::ostringstream::~ostringstream(local_f60);
                                    }
                                    curl_global_cleanup();
                                    std::ostream::flush();
                                    std::ofstream::close();
                                    bVar3 = std::unique_ptr::operator_cast_to_bool
                                                      ((unique_ptr *)&stack0xfffffffffffffdd8);
                                    if (bVar3) {
                                      pcVar15 = std::
                                                unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                                ::operator->((
                                                  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                                  *)&stack0xfffffffffffffdd8);
                                      cmCryptoHash::HashFile
                                                ((string *)local_fa0,pcVar15,(string *)&timeout);
                                      uVar13 = std::__cxx11::string::empty();
                                      if ((uVar13 & 1) == 0) {
                                        bVar3 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&hashMatchMSG.field_2 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_fa0);
                                        if (bVar3) {
                                          std::__cxx11::ostringstream::ostringstream
                                                    ((ostringstream *)
                                                     (status.field_2._M_local_buf + 8));
                                          poVar14 = std::operator<<((ostream *)
                                                                    ((long)&status.field_2 + 8),
                                                                    "DOWNLOAD HASH mismatch");
                                          poVar14 = (ostream *)
                                                    std::ostream::operator<<
                                                              (poVar14,std::
                                                  endl<char,std::char_traits<char>>);
                                          poVar14 = std::operator<<(poVar14,"  for file: [");
                                          poVar14 = std::operator<<(poVar14,(string *)&timeout);
                                          poVar14 = std::operator<<(poVar14,"]");
                                          poVar14 = (ostream *)
                                                    std::ostream::operator<<
                                                              (poVar14,std::
                                                  endl<char,std::char_traits<char>>);
                                          poVar14 = std::operator<<(poVar14,"    expected hash: [");
                                          poVar14 = std::operator<<(poVar14,(string *)
                                                                            (hashMatchMSG.field_2.
                                                                             _M_local_buf + 8));
                                          poVar14 = std::operator<<(poVar14,"]");
                                          poVar14 = (ostream *)
                                                    std::ostream::operator<<
                                                              (poVar14,std::
                                                  endl<char,std::char_traits<char>>);
                                          poVar14 = std::operator<<(poVar14,"      actual hash: [");
                                          poVar14 = std::operator<<(poVar14,(string *)local_fa0);
                                          poVar14 = std::operator<<(poVar14,"]");
                                          poVar14 = (ostream *)
                                                    std::ostream::operator<<
                                                              (poVar14,std::
                                                  endl<char,std::char_traits<char>>);
                                          poVar14 = std::operator<<(poVar14,"           status: [");
                                          poVar14 = (ostream *)
                                                    std::ostream::operator<<
                                                              (poVar14,e.field_2._12_4_);
                                          poVar14 = std::operator<<(poVar14,";\"");
                                          pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                          poVar14 = std::operator<<(poVar14,pcVar9);
                                          poVar14 = std::operator<<(poVar14,"\"]");
                                          std::ostream::operator<<
                                                    (poVar14,std::endl<char,std::char_traits<char>>)
                                          ;
                                          uVar13 = std::__cxx11::string::empty();
                                          if (((uVar13 & 1) == 0) && (e.field_2._12_4_ == 0)) {
                                            std::operator+(&local_11a0,"1;HASH mismatch: expected: "
                                                           ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&hashMatchMSG.field_2 + 8));
                                            std::operator+(&local_1180,&local_11a0," actual: ");
                                            std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1160,&local_1180,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_fa0);
                                            std::__cxx11::string::~string((string *)&local_1180);
                                            std::__cxx11::string::~string((string *)&local_11a0);
                                            pcVar1 = (this->super_cmCommand).Makefile;
                                            pcVar9 = (char *)std::__cxx11::string::c_str();
                                            cmMakefile::AddDefinition
                                                      (pcVar1,(string *)local_f0,pcVar9);
                                            std::__cxx11::string::~string((string *)local_1160);
                                          }
                                          std::__cxx11::ostringstream::str();
                                          cmCommand::SetError(&this->super_cmCommand,&local_11c0);
                                          std::__cxx11::string::~string((string *)&local_11c0);
                                          this_local._7_1_ = 0;
                                          local_2a0 = 1;
                                          std::__cxx11::ostringstream::~ostringstream
                                                    ((ostringstream *)
                                                     (status.field_2._M_local_buf + 8));
                                        }
                                        else {
                                          local_2a0 = 0;
                                        }
                                      }
                                      else {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_fc0,
                                                   "DOWNLOAD cannot compute hash on downloaded file"
                                                   ,&local_fc1);
                                        cmCommand::SetError(&this->super_cmCommand,&local_fc0);
                                        std::__cxx11::string::~string((string *)&local_fc0);
                                        std::allocator<char>::~allocator(&local_fc1);
                                        this_local._7_1_ = 0;
                                        local_2a0 = 1;
                                      }
                                      std::__cxx11::string::~string((string *)local_fa0);
                                      if (local_2a0 != 0) goto LAB_002bff7d;
                                    }
                                    uVar13 = std::__cxx11::string::empty();
                                    if ((uVar13 & 1) == 0) {
                                      local_11c1 = '\0';
                                      std::vector<char,_std::allocator<char>_>::push_back
                                                ((vector<char,_std::allocator<char>_> *)
                                                 ((long)&e_7.field_2 + 8),&local_11c1);
                                      pcVar1 = (this->super_cmCommand).Makefile;
                                      pcVar9 = std::vector<char,_std::allocator<char>_>::data
                                                         ((vector<char,_std::allocator<char>_> *)
                                                          ((long)&e_7.field_2 + 8));
                                      cmMakefile::AddDefinition
                                                (pcVar1,(string *)((long)&statusVar.field_2 + 8),
                                                 pcVar9);
                                    }
                                    this_local._7_1_ = 1;
                                    local_2a0 = 1;
                                  }
LAB_002bff7d:
                                  anon_unknown.dwarf_353d22::cURLProgressHelper::~cURLProgressHelper
                                            ((cURLProgressHelper *)((long)&e_12.field_2 + 8));
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_c98,
                                             "DOWNLOAD cannot set follow-redirect option: ",
                                             (allocator<char> *)(e_10.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(e_10.field_2._M_local_buf + 0xf));
                                  pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                  std::__cxx11::string::operator+=((string *)local_c98,pcVar9);
                                  cmCommand::SetError(&this->super_cmCommand,(string *)local_c98);
                                  this_local._7_1_ = 0;
                                  local_2a0 = 1;
                                  std::__cxx11::string::~string((string *)local_c98);
                                }
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_c70,"DOWNLOAD cannot set debug data: ",
                                           (allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                                pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                std::__cxx11::string::operator+=((string *)local_c70,pcVar9);
                                cmCommand::SetError(&this->super_cmCommand,(string *)local_c70);
                                this_local._7_1_ = 0;
                                local_2a0 = 1;
                                std::__cxx11::string::~string((string *)local_c70);
                              }
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_c48,"DOWNLOAD cannot set write data: ",
                                         (allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                              pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                              std::__cxx11::string::operator+=((string *)local_c48,pcVar9);
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_c48);
                              this_local._7_1_ = 0;
                              local_2a0 = 1;
                              std::__cxx11::string::~string((string *)local_c48);
                            }
LAB_002bff99:
                            std::vector<char,_std::allocator<char>_>::~vector
                                      ((vector<char,_std::allocator<char>_> *)
                                       ((long)&e_7.field_2 + 8));
                          }
                          std::__cxx11::string::~string
                                    ((string *)
                                     &chunkDebug.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x10);
                        }
                        std::__cxx11::string::~string((string *)&local_bc8);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_b70,"Unable to set TLS/SSL Verify on: ",
                                   (allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                        pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                        std::__cxx11::string::operator+=((string *)local_b70,pcVar9);
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_b70);
                        this_local._7_1_ = 0;
                        local_2a0 = 1;
                        std::__cxx11::string::~string((string *)local_b70);
                      }
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_b48,"DOWNLOAD cannot set debug function: ",
                               (allocator<char> *)(e_5.field_2._M_local_buf + 0xf));
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(e_5.field_2._M_local_buf + 0xf));
                    pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                    std::__cxx11::string::operator+=((string *)local_b48,pcVar9);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_b48);
                    this_local._7_1_ = 0;
                    local_2a0 = 1;
                    std::__cxx11::string::~string((string *)local_b48);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_b20,"DOWNLOAD cannot set write function: ",
                             (allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
                  pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                  std::__cxx11::string::operator+=((string *)local_b20,pcVar9);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_b20);
                  this_local._7_1_ = 0;
                  local_2a0 = 1;
                  std::__cxx11::string::~string((string *)local_b20);
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_af8,"DOWNLOAD cannot set user agent option: ",
                           (allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
                std::allocator<char>::~allocator
                          ((allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
                pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                std::__cxx11::string::operator+=((string *)local_af8,pcVar9);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_af8);
                this_local._7_1_ = 0;
                local_2a0 = 1;
                std::__cxx11::string::~string((string *)local_af8);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_ad0,"DOWNLOAD cannot set http failure option: ",
                         (allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
              pcVar9 = curl_easy_strerror(e.field_2._12_4_);
              std::__cxx11::string::operator+=((string *)local_ad0,pcVar9);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_ad0);
              this_local._7_1_ = 0;
              local_2a0 = 1;
              std::__cxx11::string::~string((string *)local_ad0);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_aa8,"DOWNLOAD cannot set url: ",
                       (allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
            pcVar9 = curl_easy_strerror(e.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_aa8,pcVar9);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_aa8);
            this_local._7_1_ = 0;
            local_2a0 = 1;
            std::__cxx11::string::~string((string *)local_aa8);
          }
          anon_unknown.dwarf_353d22::cURLEasyGuard::~cURLEasyGuard
                    ((cURLEasyGuard *)&stack0xfffffffffffff580);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a40,"DOWNLOAD cannot open file for write.",
                   (allocator<char> *)((long)&curl + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_a40);
        std::__cxx11::string::~string((string *)&local_a40);
        std::allocator<char>::~allocator((allocator<char> *)((long)&curl + 7));
        this_local._7_1_ = 0;
        local_2a0 = 1;
      }
      std::ofstream::~ofstream(&local_a20);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8,"DOWNLOAD error: cannot create directory \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errstring.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_800,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8,
                     "\' - Specify file by full path name and verify that you have directory creation and file write privileges."
                    );
      std::__cxx11::string::~string((string *)&fout.field_0x1f8);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_800);
      this_local._7_1_ = 0;
      local_2a0 = 1;
      std::__cxx11::string::~string((string *)local_800);
    }
    std::__cxx11::string::~string((string *)(errstring.field_2._M_local_buf + 8));
  }
LAB_002c0044:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_268);
  std::__cxx11::string::~string
            ((string *)
             &curl_headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
            ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
             &stack0xfffffffffffffdd8);
  std::__cxx11::string::~string((string *)&hash);
  std::__cxx11::string::~string((string *)(hashMatchMSG.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&timeout);
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
LAB_002c014d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if (args.size() < 3) {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
  }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string netrc_level = this->Makefile->GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    this->Makefile->GetSafeDefinition("CMAKE_NETRC_FILE");
  std::string expectedHash;
  std::string hashMatchMSG;
  std::unique_ptr<cmCryptoHash> hash;
  bool showProgress = false;
  std::string userpwd;

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmSystemTools::IsOn(*i);
      } else {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = i->c_str();
      } else {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        this->SetError("DOWNLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        this->SetError("DOWNLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "EXPECTED_MD5") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
      }
      hash = cm::make_unique<cmCryptoHash>(cmCryptoHash::AlgoMD5);
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "EXPECTED_HASH") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
      }
      std::string::size_type pos = i->find("=");
      if (pos == std::string::npos) {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
      }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos + 1));
      hash = std::unique_ptr<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if (!hash) {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
      }
      hashMatchMSG = algo + " hash";
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, err);
    }
    ++i;
  }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if (cmSystemTools::FileExists(file) && hash.get()) {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if (actualHash == expectedHash) {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if (!statusVar.empty()) {
        std::ostringstream result;
        result << 0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar, result.str().c_str());
      }
      return true;
    }
  }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if (!cmSystemTools::FileExists(dir) && !cmSystemTools::MakeDirectory(dir)) {
    std::string errstring = "DOWNLOAD error: cannot create directory '" + dir +
      "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
  }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if (!fout) {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
  }

#  if defined(_WIN32)
  url = fix_file_url_windows(url);
#  endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
  }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
  }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    this->SetError(cainfo_err);
    return false;
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    this->SetError(netrc_option_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
  }

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "DOWNLOAD cannot set user password: ");
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << static_cast<int>(res) << ";\"" << ::curl_easy_strerror(res)
           << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash) {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty()) {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
    }

    if (expectedHash != actualHash) {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
          << "  for file: [" << file << "]" << std::endl
          << "    expected hash: [" << expectedHash << "]" << std::endl
          << "      actual hash: [" << actualHash << "]" << std::endl
          << "           status: [" << static_cast<int>(res) << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl;

      if (!statusVar.empty() && res == 0) {
        std::string status = "1;HASH mismatch: "
                             "expected: " +
          expectedHash + " actual: " + actualHash;
        this->Makefile->AddDefinition(statusVar, status.c_str());
      }

      this->SetError(oss.str());
      return false;
    }
  }

  if (!logVar.empty()) {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, chunkDebug.data());
  }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}